

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# model-base-ekf-flex-estimator-imu.cpp
# Opt level: O0

void __thiscall
stateObservation::flexibilityEstimation::ModelBaseEKFFlexEstimatorIMU::
updateMeasurementCovarianceMatrix_(ModelBaseEKFFlexEstimatorIMU *this)

{
  long lVar1;
  Index IVar2;
  int iVar3;
  int iVar4;
  uint uVar5;
  Index IVar6;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  Type local_1d0;
  IdentityReturnType local_198;
  CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_identity_op<double>,_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>
  local_180;
  Type local_140;
  Type local_108;
  Type local_d0;
  long local_98;
  Index i;
  Type local_58;
  Index local_20;
  Index currIndex;
  Index realIndex;
  ModelBaseEKFFlexEstimatorIMU *this_local;
  
  realIndex = (Index)this;
  IVar6 = Eigen::PlainObjectBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::rows
                    (&(this->R_).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>);
  iVar3 = (*(this->super_EKFFlexibilityEstimatorBase).super_FlexibilityEstimatorBase.
            _vptr_FlexibilityEstimatorBase[0x14])();
  if (IVar6 != CONCAT44(extraout_var,iVar3)) {
    currIndex = Eigen::PlainObjectBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::rows
                          (&(this->R_).
                            super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>);
    iVar3 = (*(this->super_EKFFlexibilityEstimatorBase).super_FlexibilityEstimatorBase.
              _vptr_FlexibilityEstimatorBase[0x14])();
    iVar4 = (*(this->super_EKFFlexibilityEstimatorBase).super_FlexibilityEstimatorBase.
              _vptr_FlexibilityEstimatorBase[0x14])();
    Eigen::PlainObjectBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::conservativeResize
              (&(this->R_).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>,
               CONCAT44(extraout_var_00,iVar3),CONCAT44(extraout_var_01,iVar4));
    IVar2 = currIndex;
    local_20 = 6;
    if (((this->useFTSensors_ & 1U) != 0) &&
       (uVar5 = IMUElasticLocalFrameDynamicalSystem::getContactsNumber(&this->functor_),
       IVar6 = local_20, IVar2 < (long)((ulong)(uVar5 * 6) + 6))) {
      uVar5 = IMUElasticLocalFrameDynamicalSystem::getContactsNumber(&this->functor_);
      Eigen::DenseBase<Eigen::Matrix<double,-1,-1,0,-1,-1>>::block<unsigned_int,long>
                (&local_58,(DenseBase<Eigen::Matrix<double,_1,_1,0,_1,_1>> *)&this->R_,IVar6,0,
                 uVar5 * 6,local_20);
      Eigen::DenseBase<Eigen::Block<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_-1,_-1,_false>_>::
      setZero((DenseBase<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false>_> *)
              &local_58);
      IVar6 = local_20;
      uVar5 = IMUElasticLocalFrameDynamicalSystem::getContactsNumber(&this->functor_);
      Eigen::DenseBase<Eigen::Matrix<double,-1,-1,0,-1,-1>>::block<long,unsigned_int>
                ((Type *)&i,(DenseBase<Eigen::Matrix<double,_1,_1,0,_1,_1>> *)&this->R_,0,IVar6,
                 IVar6,uVar5 * 6);
      Eigen::DenseBase<Eigen::Block<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_-1,_-1,_false>_>::
      setZero((DenseBase<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false>_> *)
              &i);
      for (local_98 = 0; lVar1 = local_98,
          uVar5 = IMUElasticLocalFrameDynamicalSystem::getContactsNumber(&this->functor_),
          lVar1 < (long)(ulong)uVar5; local_98 = local_98 + 1) {
        Eigen::DenseBase<Eigen::Matrix<double,-1,-1,0,-1,-1>>::block<int,int>
                  (&local_d0,(DenseBase<Eigen::Matrix<double,_1,_1,0,_1,_1>> *)&this->R_,local_20,
                   local_20,6,6);
        Eigen::Block<Eigen::Matrix<double,-1,-1,0,-1,-1>,-1,-1,false>::operator=
                  ((Block<Eigen::Matrix<double,_1,_1,0,_1,_1>,_1,_1,false> *)&local_d0,
                   (DenseBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)&this->forceVariance_);
        local_20 = local_20 + 6;
      }
    }
    if (((this->withAbsolutePos_ & 1U) != 0) && (currIndex < local_20 + 6)) {
      Eigen::DenseBase<Eigen::Matrix<double,-1,-1,0,-1,-1>>::block<int,long>
                (&local_108,(DenseBase<Eigen::Matrix<double,_1,_1,0,_1,_1>> *)&this->R_,local_20,0,6
                 ,local_20);
      Eigen::DenseBase<Eigen::Block<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_-1,_-1,_false>_>::
      setZero((DenseBase<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false>_> *)
              &local_108);
      Eigen::DenseBase<Eigen::Matrix<double,-1,-1,0,-1,-1>>::block<long,int>
                (&local_140,(DenseBase<Eigen::Matrix<double,_1,_1,0,_1,_1>> *)&this->R_,0,local_20,
                 local_20,6);
      Eigen::DenseBase<Eigen::Block<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_-1,_-1,_false>_>::
      setZero((DenseBase<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false>_> *)
              &local_140);
      Eigen::MatrixBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::Identity(&local_198,6,6);
      Eigen::
      MatrixBase<Eigen::CwiseNullaryOp<Eigen::internal::scalar_identity_op<double>,Eigen::Matrix<double,-1,-1,0,-1,-1>>>
      ::operator*(&local_180,
                  (MatrixBase<Eigen::CwiseNullaryOp<Eigen::internal::scalar_identity_op<double>,Eigen::Matrix<double,_1,_1,0,_1,_1>>>
                   *)&local_198,&this->absPosVariance_);
      Eigen::DenseBase<Eigen::Matrix<double,-1,-1,0,-1,-1>>::block<int,int>
                (&local_1d0,(DenseBase<Eigen::Matrix<double,_1,_1,0,_1,_1>> *)&this->R_,local_20,
                 local_20,6,6);
      Eigen::Block<Eigen::Matrix<double,-1,-1,0,-1,-1>,-1,-1,false>::operator=
                ((Block<Eigen::Matrix<double,_1,_1,0,_1,_1>,_1,_1,false> *)&local_1d0,
                 (DenseBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_identity_op<double>,_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>_>
                  *)&local_180);
      local_20 = local_20 + 6;
    }
  }
  KalmanFilterBase::setR
            (&(this->super_EKFFlexibilityEstimatorBase).ekf_.super_KalmanFilterBase,&this->R_);
  return;
}

Assistant:

void ModelBaseEKFFlexEstimatorIMU::updateMeasurementCovarianceMatrix_()
{

  if(R_.rows() != getMeasurementSize())
  {

    Index realIndex = R_.rows();
    R_.conservativeResize(getMeasurementSize(), getMeasurementSize());

    Index currIndex = 6;
    if(useFTSensors_)
    {
      /// if the force part of the matrix is not filled
      if(realIndex < currIndex + functor_.getContactsNumber() * 6)
      {
        R_.block(currIndex, 0, functor_.getContactsNumber() * 6, currIndex).setZero();
        R_.block(0, currIndex, currIndex, functor_.getContactsNumber() * 6).setZero();
        for(Index i = 0; i < functor_.getContactsNumber(); ++i)
        {
          R_.block(currIndex, currIndex, 6, 6) = forceVariance_;
          currIndex += 6;
        }
      }
    }

    if(withAbsolutePos_)
    {
      if(realIndex < currIndex + 6)
      {

        R_.block(currIndex, 0, 6, currIndex).setZero();
        R_.block(0, currIndex, currIndex, 6).setZero();
        R_.block(currIndex, currIndex, 6, 6) = Matrix::Identity(6, 6) * absPosVariance_;

        currIndex += 6;
      }
    }
  }
  ekf_.setR(R_);
}